

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1M2L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  iterator __position;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this;
  long lVar5;
  ostream *poVar6;
  float *pfVar7;
  char *__function;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Matrix<float,_3,_1,_0,_3,_1> t;
  float tz;
  vector<float,_std::allocator<float>_> realRoots;
  Matrix<float,_4,_4,_0,_4,_4> Tw;
  Matrix<float,_5,_1,_0,_5,_1> factors;
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  trans;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines3;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines2;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_3,_3,_0,_3,_3> local_978;
  ulong local_948;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined1 local_918 [8];
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  Matrix<float,_4,_4,_0,_4,_4> *local_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_8b8;
  Matrix<float,_4,_4,_0,_4,_4> *local_8b0;
  undefined8 local_8a0;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined1 local_868 [8];
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined1 local_7e8 [16];
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *local_7a0;
  SrcXprType local_798;
  float *local_790;
  undefined1 local_788 [12];
  float local_77c;
  Scalar local_778;
  Scalar local_774;
  undefined4 local_770;
  float local_76c;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_6e8;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  undefined1 local_698 [16];
  undefined1 local_688 [8];
  undefined8 uStack_680;
  undefined8 uStack_678;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  long local_658;
  undefined4 local_650;
  undefined4 local_64c;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined8 local_628;
  float fStack_620;
  float fStack_61c;
  float local_618;
  undefined1 local_608 [12];
  undefined1 auStack_5fc [8];
  undefined8 local_5f4;
  float fStack_5ec;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  float fStack_5d0;
  float afStack_5cc [6];
  undefined1 local_5b4 [36];
  float fStack_590;
  float afStack_58c [6];
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [16];
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  Matrix<float,_4,_4,_0,_4,_4> local_4c8;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_488;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  local_470;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  local_458;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  local_440;
  Matrix<float,_4,_4,_0,_4,_4> local_428;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float local_1cc;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  undefined8 uStack_19c;
  Matrix<float,_3,_3,_0,_3,_3> MStack_194;
  float fStack_170;
  undefined8 uStack_16c;
  float local_164;
  float fStack_160;
  float local_15c;
  Matrix<float,_3,_1,_0,_3,_1> local_158;
  Matrix<float,_3,_1,_0,_3,_1> local_148;
  Matrix<float,_6,_1,_0,_6,_1> local_138;
  Matrix<float,_6,_1,_0,_6,_1> local_118;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_f8;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_b8;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_78;
  
  pfVar7 = *(float **)lCPair;
  if ((*(float **)(lCPair + 8) == pfVar7) && ((ulong)(*(long *)(lPair + 8) - *(long *)lPair) < 0x41)
     ) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._0_8_ = *(undefined8 *)pfVar7;
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._8_8_ = *(undefined8 *)(pfVar7 + 2);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar7 + 4);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar7 + 6);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar7 + 8);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar7 + 10);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._0_8_ = *(undefined8 *)(pfVar7 + 0xc);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._8_8_ = *(undefined8 *)(pfVar7 + 0xe);
  local_7a0 = (vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  getPluckerCoord<float>(&local_440,&local_78);
  pfVar7 = *(float **)lPair;
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._0_8_ = *(undefined8 *)pfVar7;
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._8_8_ = *(undefined8 *)(pfVar7 + 2);
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar7 + 4);
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar7 + 6);
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar7 + 8);
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar7 + 10);
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._0_8_ = *(undefined8 *)(pfVar7 + 0xc);
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._8_8_ = *(undefined8 *)(pfVar7 + 0xe);
  getPluckerCoord<float>(&local_458,&local_b8);
  lVar5 = *(long *)lPair;
  local_f8.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._0_8_ = *(undefined8 *)(lVar5 + 0x40);
  local_f8.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._8_8_ = *(undefined8 *)(lVar5 + 0x48);
  local_f8.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(lVar5 + 0x50);
  local_f8.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(lVar5 + 0x58);
  local_f8.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(lVar5 + 0x60);
  local_f8.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(lVar5 + 0x68);
  local_f8.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._0_8_ = *(undefined8 *)(lVar5 + 0x70);
  local_f8.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._8_8_ = *(undefined8 *)(lVar5 + 0x78);
  getPluckerCoord<float>(&local_470,&local_f8);
  local_118.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          ((local_440.
            super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array;
  local_118.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (((local_440.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array + 2);
  local_118.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (((local_440.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array + 4
            );
  local_138.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          local_440.
          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array;
  local_138.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (local_440.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 2);
  local_138.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (local_440.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 4)
  ;
  getPredefinedTransformations1M1Q<float>(&local_488,&local_118,&local_138);
  local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          ((local_488.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array;
  local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (((local_488.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 2);
  local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (((local_488.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 4
            );
  local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _24_8_ = *(undefined8 *)
            (((local_488.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 6
            );
  local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _32_8_ = *(undefined8 *)
            (((local_488.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 8
            );
  local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _40_8_ = *(undefined8 *)
            (((local_488.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array +
            10);
  local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _48_8_ = *(undefined8 *)
            (((local_488.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array +
            0xc);
  local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _56_8_ = *(undefined8 *)
            (((local_488.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array +
            0xe);
  local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          local_488.
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (local_488.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
  local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (local_488.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4)
  ;
  local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _24_8_ = *(undefined8 *)
            (local_488.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6)
  ;
  local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _32_8_ = *(undefined8 *)
            (local_488.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8)
  ;
  local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _40_8_ = *(undefined8 *)
            (local_488.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10
            );
  local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _48_8_ = *(undefined8 *)
            (local_488.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
            0xc);
  local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _56_8_ = *(undefined8 *)
            (local_488.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
            0xe);
  local_1e8._0_4_ = 1.0;
  local_1e8._4_8_ = 0;
  local_1e8._12_4_ = 0.0;
  fStack_1d8 = 0.0;
  fStack_1d4 = 0.0;
  fStack_1d0 = 0.0;
  local_1cc = 1.0;
  uStack_1c8 = 0;
  local_1c0 = 0;
  local_1b8 = 0;
  fStack_1b0 = 1.0;
  fStack_1ac = 0.0;
  fStack_1a8 = 0.0;
  fStack_1a4 = 0.0;
  fStack_1a0 = 0.0;
  uStack_19c = 0;
  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       1.0;
  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  fStack_170 = 0.0;
  uStack_16c = 0;
  local_164 = 0.0;
  fStack_160 = 0.0;
  local_15c = 1.0;
  local_608._0_4_ = 1.0;
  local_608._4_8_ = 0;
  auStack_5fc = (undefined1  [8])0x0;
  local_5f4 = (SrcEvaluatorType *)0x0;
  fStack_5ec = 1.0;
  uStack_5e8 = 0;
  uStack_5e0 = 0;
  uStack_5d8 = 0;
  fStack_5d0 = 1.0;
  afStack_5cc[0] = 0.0;
  afStack_5cc[1] = 0.0;
  afStack_5cc[2] = 0.0;
  afStack_5cc[3] = 0.0;
  afStack_5cc[4] = 0.0;
  afStack_5cc[5] = 0.0;
  local_5b4._0_4_ = 1.0;
  local_5b4._4_4_ = 0.0;
  local_5b4._8_4_ = 0.0;
  local_5b4._12_4_ = 0.0;
  local_5b4._16_4_ = 0.0;
  local_5b4._20_4_ = 0.0;
  local_5b4._24_4_ = 0.0;
  local_5b4._28_4_ = 1.0;
  local_5b4._32_4_ = 0.0;
  fStack_590 = 0.0;
  afStack_58c[0] = 0.0;
  afStack_58c[1] = 0.0;
  afStack_58c[2] = 0.0;
  afStack_58c[3] = 0.0;
  afStack_58c[4] = 1.0;
  uStack_910._0_4_ = 4.2039e-45;
  uStack_910._4_4_ = 0.0;
  uStack_908._0_4_ = 4.2039e-45;
  uStack_908._4_4_ = 0.0;
  local_8f8 = 0;
  uStack_8f0 = (Matrix<float,_4,_4,_0,_4,_4> *)0x0;
  local_8e8 = 6;
  uStack_678 = &local_6e8;
  local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_
       = (XprTypeNested)local_1e8;
  local_918 = (undefined1  [8])local_1e8;
  uStack_900 = (XprTypeNested)local_1e8;
  local_868 = (undefined1  [8])&local_4c8;
  local_670 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_918;
  local_688 = (undefined1  [8])&local_978;
  uStack_680 = (DstXprType *)local_868;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_688);
  local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_
       = &MStack_194;
  uStack_910._0_4_ = 4.2039e-45;
  uStack_910._4_4_ = 0.0;
  uStack_908._0_4_ = 4.2039e-45;
  uStack_908._4_4_ = 0.0;
  local_8f8 = 3;
  uStack_8f0 = (Matrix<float,_4,_4,_0,_4,_4> *)0x3;
  local_8e8 = 6;
  uStack_678 = &local_6e8;
  local_918 = (undefined1  [8])
              local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array._0_8_;
  uStack_900 = (XprTypeNested)local_1e8;
  local_868 = (undefined1  [8])&local_4c8;
  local_670 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_918;
  local_688 = (undefined1  [8])&local_978;
  uStack_680 = (DstXprType *)local_868;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_688);
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<float>(&local_978,&local_148);
  local_868 = (undefined1  [8])(local_1e8 + 0xc);
  local_8d0 = 0;
  uStack_8c8 = 0;
  uStack_860 = 3;
  local_858 = 3;
  local_848 = 3;
  uStack_840 = 0;
  local_838 = 6;
  local_658 = 3;
  uStack_910._0_4_ =
       -local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [2];
  uStack_910._4_4_ =
       -local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [3];
  local_918 = (undefined1  [8])
              (local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array._0_8_ ^ 0x8000000080000000);
  uStack_908._0_4_ =
       -local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [4];
  uStack_908._4_4_ =
       -local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [5];
  uStack_900 = (XprTypeNested)
               (CONCAT44(local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[7],
                         local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6]) ^ 0x8000000080000000);
  local_8f8 = CONCAT44(local_8f8._4_4_,
                       local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[8]) ^ 0x80000000;
  local_8e8 = 3;
  uStack_8e0 = 3;
  local_8c0 = 4;
  local_8a0 = 3;
  uStack_8f0 = &local_4c8;
  local_8d8 = &local_4c8;
  local_8b8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_918;
  local_8b0 = &local_4c8;
  uStack_850 = (XprTypeNested)local_1e8;
  local_6e8.m_dst = (SrcEvaluatorType *)&local_628;
  local_6e8.m_src = (SrcEvaluatorType *)local_918;
  local_6e8.m_functor = (assign_op<float,_float> *)&local_798;
  local_6e8.m_dstExpr = (DstXprType *)local_688;
  local_628 = (float *)local_688;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_1>
  ::run(&local_6e8);
  if ((uStack_860 == 3) && (local_858 == local_658)) {
    local_6e8.m_dst = (DstEvaluatorType *)local_868;
    local_918 = (undefined1  [8])&local_6e8;
    uStack_900 = (XprTypeNested)local_868;
    local_628 = (float *)local_688;
    uStack_910 = (SrcEvaluatorType *)&local_628;
    uStack_908 = (assign_op<float,_float> *)&local_798;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_918);
    uStack_910._0_4_ = 4.2039e-45;
    uStack_910._4_4_ = 0.0;
    uStack_908._0_4_ = 4.2039e-45;
    uStack_908._4_4_ = 0.0;
    local_8f8 = 0;
    uStack_8f0 = (Matrix<float,_4,_4,_0,_4,_4> *)0x0;
    local_8e8 = 6;
    local_868 = (undefined1  [8])&local_428;
    local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _0_8_ = (DstXprType *)local_608;
    local_918 = (undefined1  [8])local_608;
    uStack_900 = (XprTypeNested)local_608;
    local_670 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_918;
    local_688 = (undefined1  [8])&local_978;
    uStack_678 = &local_6e8;
    uStack_680 = (DstXprType *)local_868;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_688);
    local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _0_8_ = local_5b4;
    uStack_910._0_4_ = 4.2039e-45;
    uStack_910._4_4_ = 0.0;
    uStack_908._0_4_ = 4.2039e-45;
    uStack_908._4_4_ = 0.0;
    local_8f8 = 3;
    uStack_8f0 = (Matrix<float,_4,_4,_0,_4,_4> *)0x3;
    local_8e8 = 6;
    local_918 = (undefined1  [8])
                local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array._0_8_;
    uStack_900 = (XprTypeNested)local_608;
    local_868 = (undefined1  [8])&local_428;
    local_670 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_918;
    local_688 = (undefined1  [8])&local_978;
    uStack_678 = &local_6e8;
    uStack_680 = (DstXprType *)local_868;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_688);
    local_158.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xc];
    local_158.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd];
    local_158.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_428.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xe];
    getSkew<float>(&local_978,&local_158);
    local_868 = (undefined1  [8])auStack_5fc;
    local_8d0 = 0;
    uStack_8c8 = 0;
    uStack_860 = 3;
    local_858 = 3;
    uStack_850 = (XprTypeNested)local_608;
    local_848 = 3;
    uStack_840 = 0;
    local_838 = 6;
    uStack_910._0_4_ =
         -local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2];
    uStack_910._4_4_ =
         -local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3];
    local_918 = (undefined1  [8])
                (local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array._0_8_ ^ 0x8000000080000000);
    uStack_908._0_4_ =
         -local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4];
    uStack_908._4_4_ =
         -local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5];
    uStack_900 = (XprTypeNested)
                 (CONCAT44(local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[7],
                           local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[6]) ^ 0x8000000080000000);
    local_658 = 3;
    local_8f8 = CONCAT44(local_8f8._4_4_,
                         local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[8]) ^ 0x80000000;
    local_8e8 = 3;
    uStack_8e0 = 3;
    local_8c0 = 4;
    local_8a0 = 3;
    local_6e8.m_dstExpr = (DstXprType *)local_688;
    uStack_8f0 = &local_428;
    local_8d8 = &local_428;
    local_8b8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_918;
    local_8b0 = &local_428;
    local_6e8.m_dst = (SrcEvaluatorType *)&local_628;
    local_6e8.m_src = (SrcEvaluatorType *)local_918;
    local_6e8.m_functor = (assign_op<float,_float> *)&local_798;
    local_628 = (float *)local_6e8.m_dstExpr;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_1>
    ::run(&local_6e8);
    local_628 = (float *)local_688;
    if ((uStack_860 == 3) && (local_858 == local_658)) {
      local_6e8.m_dst = (DstEvaluatorType *)local_868;
      local_918 = (undefined1  [8])&local_6e8;
      uStack_900 = (XprTypeNested)local_868;
      uStack_910 = (SrcEvaluatorType *)&local_628;
      uStack_908 = (assign_op<float,_float> *)&local_798;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_918);
      fVar9 = ((local_458.
                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
      ;
      fVar23 = ((local_458.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [3];
      fVar10 = ((local_458.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [1];
      fVar11 = ((local_458.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [2];
      fVar12 = ((local_458.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [3];
      fVar14 = ((local_458.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [4];
      fVar15 = ((local_458.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [5];
      fVar16 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
      ;
      fVar17 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
      ;
      fVar18 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
      ;
      local_7c8 = fStack_170 * fVar15 +
                  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[3] * fVar14 +
                  fVar23 * fStack_1a0 +
                  (float)local_1b8 * fVar11 + fStack_1d0 * fVar10 + (float)local_1e8._0_4_ * fVar9;
      fStack_934 = (float)uStack_16c * fVar15 +
                   MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[4] * fVar14 +
                   fVar23 * (float)uStack_19c +
                   local_1b8._4_4_ * fVar11 + local_1cc * fVar10 + (float)local_1e8._4_4_ * fVar9;
      fStack_930 = uStack_16c._4_4_ * fVar15 +
                   MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[5] * fVar14 +
                   fVar23 * uStack_19c._4_4_ +
                   fStack_1b0 * fVar11 + (float)uStack_1c8 * fVar10 + (float)local_1e8._8_4_ * fVar9
      ;
      fStack_92c = local_164 * fVar15 +
                   MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[6] * fVar14 +
                   fVar23 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[0] +
                   fStack_1ac * fVar11 + uStack_1c8._4_4_ * fVar10 + (float)local_1e8._12_4_ * fVar9
      ;
      fVar23 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
      ;
      fVar19 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
      ;
      fVar20 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
      ;
      fVar21 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
      ;
      fVar13 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
      ;
      fVar22 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
      ;
      fVar24 = local_458.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
      ;
      fVar31 = fVar24 * fStack_590 +
               fVar22 * (float)local_5b4._12_4_ +
               fVar18 * afStack_5cc[3] +
               fVar21 * (float)uStack_5d8 +
               fVar23 * local_5f4._4_4_ + fVar16 * (float)local_608._0_4_;
      local_748 = fVar24 * afStack_58c[0] +
                  fVar22 * (float)local_5b4._16_4_ +
                  fVar18 * afStack_5cc[4] +
                  fVar21 * uStack_5d8._4_4_ + fVar23 * fStack_5ec + fVar16 * (float)local_608._4_4_;
      fStack_360 = fVar24 * afStack_58c[1] +
                   fVar22 * (float)local_5b4._20_4_ +
                   fVar18 * afStack_5cc[5] +
                   fVar21 * fStack_5d0 +
                   fVar23 * (float)uStack_5e8 + fVar16 * (float)local_608._8_4_;
      local_898 = fVar24 * afStack_58c[2] +
                  fVar22 * (float)local_5b4._24_4_ +
                  fVar18 * (float)local_5b4._0_4_ +
                  fVar21 * afStack_5cc[0] +
                  fVar23 * uStack_5e8._4_4_ + fVar16 * (float)auStack_5fc._0_4_;
      fStack_7cc = afStack_58c[3] * fVar24 + (float)local_5b4._28_4_ * fVar22 +
                   (float)local_5b4._4_4_ * fVar13;
      local_7d8 = fStack_7cc +
                  (float)uStack_5e0 * fVar23 + afStack_5cc[1] * fVar21 +
                  (float)auStack_5fc._4_4_ * fVar16;
      fStack_7d4 = fStack_7cc + fStack_7cc;
      fStack_7d0 = fStack_7cc + fVar19 * 0.0 + fVar22 * 0.0 + fVar17 * 0.0;
      fStack_7cc = fStack_7cc + fVar20 * 0.0 + fVar24 * 0.0 + fVar18 * 0.0;
      fStack_72c = fVar24 * afStack_58c[4] + fVar22 * (float)local_5b4._32_4_ +
                   fVar13 * (float)local_5b4._8_4_;
      local_738 = fStack_72c +
                  fVar23 * uStack_5e0._4_4_ + fVar21 * afStack_5cc[2] + fVar16 * (float)local_5f4;
      fStack_734 = fStack_72c + fStack_72c;
      fStack_730 = fStack_72c +
                   fVar19 * uStack_5d8._4_4_ + fVar22 * afStack_5cc[4] + fVar17 * fStack_5ec;
      fStack_72c = fStack_72c +
                   fVar20 * fStack_5d0 + fVar24 * afStack_5cc[5] + fVar18 * (float)uStack_5e8;
      fVar23 = ((local_470.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [0];
      fVar16 = ((local_470.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [3];
      fVar17 = ((local_470.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [1];
      fVar18 = ((local_470.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [2];
      fVar19 = ((local_470.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [3];
      fVar20 = ((local_470.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [4];
      fVar21 = ((local_470.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
               [5];
      local_308 = fStack_170 * fVar21 +
                  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[3] * fVar20 +
                  fVar16 * fStack_1a0 +
                  (float)local_1b8 * fVar18 + fStack_1d0 * fVar17 + (float)local_1e8._0_4_ * fVar23;
      local_928 = (float)uStack_16c * fVar21 +
                  MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[4] * fVar20 +
                  fVar16 * (float)uStack_19c +
                  local_1b8._4_4_ * fVar18 + local_1cc * fVar17 + (float)local_1e8._4_4_ * fVar23;
      fStack_300 = uStack_16c._4_4_ * fVar21 +
                   MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[5] * fVar20 +
                   fVar16 * uStack_19c._4_4_ +
                   fStack_1b0 * fVar18 +
                   (float)uStack_1c8 * fVar17 + (float)local_1e8._8_4_ * fVar23;
      fStack_2fc = local_164 * fVar21 +
                   MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[6] * fVar20 +
                   fVar16 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[0] +
                   fStack_1ac * fVar18 +
                   uStack_1c8._4_4_ * fVar17 + (float)local_1e8._12_4_ * fVar23;
      fVar16 = local_470.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
      ;
      fVar13 = local_470.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
      ;
      fVar22 = local_470.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
      ;
      fVar24 = local_470.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
      ;
      fVar25 = local_470.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
      ;
      fVar26 = local_470.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
      ;
      fVar27 = local_470.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
      ;
      local_4d8 = fStack_590 * fVar27 +
                  fVar26 * (float)local_5b4._12_4_ +
                  fVar13 * afStack_5cc[3] +
                  fVar24 * (float)uStack_5d8 +
                  fVar22 * local_5f4._4_4_ + fVar16 * (float)local_608._0_4_;
      fStack_4d4 = afStack_58c[0] * fVar27 +
                   fVar26 * (float)local_5b4._16_4_ +
                   fVar13 * afStack_5cc[4] +
                   fVar24 * uStack_5d8._4_4_ + fVar22 * fStack_5ec + fVar16 * (float)local_608._4_4_
      ;
      fStack_4d0 = afStack_58c[1] * fVar27 +
                   fVar26 * (float)local_5b4._20_4_ +
                   fVar13 * afStack_5cc[5] +
                   fVar24 * fStack_5d0 +
                   fVar22 * (float)uStack_5e8 + fVar16 * (float)local_608._8_4_;
      fStack_4cc = afStack_58c[2] * fVar27 +
                   fVar26 * (float)local_5b4._24_4_ +
                   fVar13 * (float)local_5b4._0_4_ +
                   fVar24 * afStack_5cc[0] +
                   fVar22 * uStack_5e8._4_4_ + fVar16 * (float)auStack_5fc._0_4_;
      fVar28 = afStack_5cc[1] * fVar24 + (float)uStack_5e0 * fVar22 +
               (float)auStack_5fc._4_4_ * fVar16;
      local_3c8 = fVar26 * (float)local_5b4._28_4_ + fVar27 * afStack_58c[3] +
                  fVar25 * (float)local_5b4._4_4_;
      fStack_1ec = fVar27 * afStack_58c[4] + fVar26 * (float)local_5b4._32_4_ +
                   fVar25 * (float)local_5b4._8_4_;
      local_1f8 = fStack_1ec +
                  fVar22 * uStack_5e0._4_4_ + fVar24 * afStack_5cc[2] + fVar16 * (float)local_5f4;
      fStack_1f4 = fStack_1ec + fStack_1ec;
      fStack_1f0 = fStack_1ec +
                   local_470.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].
                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * uStack_5d8._4_4_ + fVar26 * afStack_5cc[4] +
                   local_470.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].
                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * fStack_5ec;
      fStack_1ec = fStack_1ec +
                   local_470.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].
                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] * fStack_5d0 + fVar27 * afStack_5cc[5] + fVar13 * (float)uStack_5e8;
      auVar3._4_4_ = fStack_934;
      auVar3._0_4_ = local_7c8;
      auVar3._8_4_ = fStack_930;
      auVar3._12_4_ = fStack_92c;
      auVar2._4_4_ = local_748;
      auVar2._0_4_ = fVar31;
      auVar2._8_4_ = fStack_360;
      auVar2._12_4_ = local_898;
      local_228 = fStack_92c * local_308 * fVar31;
      local_808 = fStack_92c + fStack_92c;
      fVar13 = fVar31 * local_808 * local_308;
      local_218 = local_808 * local_308 * local_748;
      fStack_224 = -local_218;
      fStack_21c = -fStack_92c;
      fVar16 = (float)((ulong)local_1c0 >> 0x20);
      local_7b8 = fVar15 * fStack_160 +
                  fVar14 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[7] +
                  fVar12 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1] +
                  fVar11 * fStack_1a8 + fVar10 * (float)local_1c0 + fVar9 * fStack_1d8;
      fStack_7b4 = fVar15 * local_15c +
                   fVar14 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[8] +
                   fVar12 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[2] +
                   fVar11 * fStack_1a4 + fVar10 * fVar16 + fVar9 * fStack_1d4;
      fStack_7b0 = fVar15 * 0.0 + fVar14 * 0.0 + fVar12 * 0.0 +
                   fVar11 * 0.0 + fVar10 * 0.0 + fVar9 * 0.0;
      fStack_7ac = fVar15 * 0.0 + fVar14 * 0.0 + fVar12 * 0.0 +
                   fVar11 * 0.0 + fVar10 * 0.0 + fVar9 * 0.0;
      local_7e8._8_4_ = fStack_930;
      local_7e8._0_8_ = auVar3._8_8_;
      local_7e8._12_4_ = fStack_92c;
      local_4e8._8_4_ = fStack_360;
      local_4e8._0_8_ = auVar2._8_8_;
      local_4e8._12_4_ = local_898;
      fVar9 = fStack_930 * -2.0 * local_928 * local_738;
      local_208 = fStack_7b4 * local_308 * fStack_360;
      uVar8 = CONCAT44(fVar9,local_208) ^ 0x80000000;
      local_268 = fVar31 * fStack_934 * local_928;
      local_7f8 = local_7b8 * 2.0;
      fStack_7f4 = fStack_7b4 * -2.0;
      fStack_7f0 = fStack_7b0 * 0.0;
      fStack_7ec = fStack_7ac * 0.0;
      fStack_254 = fVar31 * local_7f8 * local_928;
      fVar24 = fStack_934 * 4.0;
      local_258 = fVar24 * local_308 * local_748;
      fStack_264 = -fStack_254;
      fStack_25c = -local_748;
      fVar10 = fVar21 * fStack_160 +
               fVar20 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[7] +
               fVar19 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1] +
               fVar18 * fStack_1a8 + fVar17 * (float)local_1c0 + fVar23 * fStack_1d8;
      fStack_324 = fVar21 * local_15c +
                   fVar20 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[8] +
                   fVar19 * MStack_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[2] +
                   fVar18 * fStack_1a4 + fVar17 * fVar16 + fVar23 * fStack_1d4;
      fStack_320 = fVar21 * 0.0 + fVar20 * 0.0 + fVar19 * 0.0 +
                   fVar18 * 0.0 + fVar17 * 0.0 + fVar23 * 0.0;
      fStack_31c = fVar21 * 0.0 + fVar20 * 0.0 + fVar19 * 0.0 +
                   fVar18 * 0.0 + fVar17 * 0.0 + fVar23 * 0.0;
      local_248 = fStack_324 * local_7c8 * local_748;
      fStack_244 = fStack_930 * -2.0 * local_308 * local_738;
      fStack_240 = fStack_324 * fStack_934 * local_748;
      fStack_23c = fStack_324 * local_928 * fStack_734;
      local_238 = fStack_934 * fStack_324 * fVar31;
      local_508 = -local_238;
      fStack_504 = fStack_7f4 * local_308 * fStack_360;
      local_2b8 = local_748 * local_7f8 * local_928;
      fStack_2b4 = fStack_360 * fStack_7f4 * local_928;
      fStack_2b0 = fStack_360 * fStack_7f0 * local_928;
      fStack_2ac = local_898 * fStack_7ec * local_928;
      local_728 = -local_7c8;
      fStack_724 = -fStack_934;
      fStack_720 = -fStack_930;
      fStack_71c = -fStack_92c;
      fStack_87c = local_808 * local_928;
      fVar14 = local_748 * local_728 * local_928;
      fVar18 = local_748 * fStack_87c;
      _local_648 = CONCAT44(fVar18,fVar14);
      _fStack_640 = CONCAT44(local_748 * fStack_92c * local_928,local_748 * fStack_724 * local_928);
      fVar25 = local_7c8 * 4.0;
      fStack_4fc = -fStack_934;
      fStack_500 = -fVar24 * fVar10 * local_748;
      local_878 = fStack_934 * 2.0;
      fStack_874 = fStack_92c * -4.0;
      fStack_870 = fStack_930 * 0.0;
      fStack_86c = fStack_92c * 0.0;
      local_338 = local_7c8 * local_308;
      fStack_334 = local_878 * local_928;
      fStack_330 = fStack_934 * fStack_300;
      fStack_32c = fStack_874 * fStack_2fc;
      local_2c8 = fStack_2fc * local_728 * local_748;
      local_518 = fVar24 * fStack_2fc;
      fVar21 = fVar31 * fStack_2fc * local_878;
      fStack_2c4 = -fVar21;
      fStack_2bc = -local_748;
      local_2f8 = fVar31 * fStack_934 * local_308;
      local_2d8 = -fVar13;
      fStack_2d0 = -local_748;
      fStack_2d4 = fStack_2fc * local_878 * local_748;
      fStack_2f4 = -fStack_2d4;
      fStack_2ec = -fStack_2fc;
      fVar26 = local_7b8 * 4.0 * local_928 * fVar31;
      auVar1._8_4_ = fVar26;
      auVar1._0_8_ = uVar8;
      auVar1._12_4_ = 0;
      local_938 = local_7c8 + local_7c8;
      fVar22 = local_938 * local_928;
      local_2a8 = local_898 * fVar24 * local_928;
      local_298 = fStack_334 * local_7d8;
      fStack_2a4 = -local_298;
      fStack_29c = -fStack_334;
      local_288 = fStack_930 * local_308;
      fVar30 = local_308 * local_878;
      fStack_630 = local_748 * fVar22;
      local_3e8 = fVar22 * local_898;
      fStack_3e4 = fVar30 * fVar31;
      fStack_3e0 = fStack_300 * local_878 * fStack_360;
      fStack_3dc = fStack_2fc * local_878 * local_898;
      local_318 = local_898 * local_338;
      fStack_314 = fVar31 * fStack_334;
      fStack_310 = fStack_360 * fStack_330;
      fStack_30c = local_898 * fStack_32c;
      local_758 = local_748 * local_7b8 * local_308;
      fStack_754 = fVar28 * local_3c8;
      fStack_750 = local_748 * -(fVar24 * local_928);
      fStack_74c = local_748 * fStack_334;
      local_3c8 = local_3c8 + fVar28;
      fVar23 = local_308 * local_938;
      fStack_354 = fStack_2fc * local_938;
      fStack_350 = fStack_300 * local_938;
      fStack_34c = fStack_2fc * local_938;
      local_328 = fVar10 * -fVar25;
      local_2e8 = -fVar25 * local_928;
      fStack_2e0 = local_938 * fVar10;
      fVar15 = fStack_934 * fVar10 * fVar31;
      fVar19 = local_938 * fStack_324 * fVar31;
      _local_768 = CONCAT44(fVar19,fVar15);
      _fStack_760 = CONCAT44(fStack_92c * fStack_31c * fVar31,fStack_930 * fStack_320 * fVar31);
      local_888 = fStack_87c * fVar31;
      fStack_884 = local_7b8 * 4.0 * local_308 * fVar31;
      fStack_880 = fStack_87c * fVar31;
      fStack_87c = fStack_87c * fVar31;
      fVar16 = fVar31 * local_7f8 * local_308;
      fVar32 = fVar10 * local_728 * local_748;
      _local_6a8 = CONCAT44(fVar16,fVar32);
      _fStack_6a0 = CONCAT44(local_748,fStack_324);
      fStack_2e4 = -fVar16;
      fStack_2dc = -local_748;
      local_388 = fVar31 * local_2e8;
      fStack_570 = local_748 * fStack_2e0;
      fStack_380 = fStack_360 * -fStack_934 * fStack_300;
      fStack_56c = local_898 * fStack_934 * fStack_2fc;
      local_2e8 = local_2e8 * local_7d8;
      local_378 = local_898 * fVar23;
      fStack_374 = local_748 * fStack_354;
      fStack_370 = fStack_360 * fStack_350;
      fStack_36c = local_898 * fStack_34c;
      fVar27 = fVar31 * fVar23 * fStack_4cc;
      fVar28 = fStack_354 * fVar31 * local_4d8;
      fVar13 = fVar13 * local_4d8;
      fStack_814 = fStack_4d4;
      local_818 = fStack_4d4;
      fStack_810 = fStack_4d4;
      fStack_80c = fStack_4d4;
      local_638 = -fVar18;
      fStack_634 = -fVar18;
      local_3b8 = local_748 * fVar23;
      local_348 = local_3b8 * local_3c8;
      local_358 = fVar23 * local_7d8 * fStack_4d4;
      local_368 = fVar31 * fVar22 * local_3c8;
      local_398 = fStack_630 * fStack_4cc;
      local_3a8 = local_3e8 * fStack_4d4;
      local_568 = fStack_930 * local_928 * local_738;
      fStack_564 = fStack_324 * local_878 * local_748;
      fVar23 = fStack_934 * local_308 * local_7d8;
      fVar20 = local_7f8 * local_308 * local_748;
      _local_6c8 = CONCAT44(fVar20,fVar23);
      _fStack_6c0 = CONCAT44(fStack_7f4,fStack_934);
      afStack_58c[5] = -fVar20;
      fStack_574 = -fStack_7f4;
      local_548 = -(fVar30 * local_7d8);
      fStack_544 = -fVar30;
      fStack_540 = -fVar30;
      fStack_53c = -fVar30;
      fVar17 = local_7c8 * fStack_300 * local_748;
      local_528 = fStack_934 * fStack_300 * fVar31;
      local_828 = fStack_7b4 * local_928 * fStack_360;
      fStack_824 = fStack_7b4;
      fStack_820 = fStack_7b4;
      fStack_81c = fStack_7b4;
      local_4f8 = local_748 * fVar10 * local_878;
      fVar10 = fVar10 * local_878 * fVar31;
      fVar12 = local_308 * fStack_874 * local_748;
      _local_6b8 = CONCAT44(fVar12,fVar10);
      _fStack_6b0 = CONCAT44(local_928 * fStack_86c * local_898,fStack_324 * fStack_870 * fStack_360
                            );
      fStack_940 = -fVar10;
      local_538 = local_528 * local_1f8;
      local_948 = CONCAT44(fStack_2b4,local_2b8) ^ 0x8000000080000000;
      fStack_93c = -fVar12;
      auVar2 = _local_948;
      fVar29 = fStack_300 * local_938 * fVar31;
      fVar11 = -local_7b8;
      fVar23 = local_4d8 * local_928 * fVar11 * local_748 +
               fStack_4d4 * local_758 +
               fVar15 * fStack_4d4 +
               local_4d8 * -(fStack_934 * local_928) * local_7d8 +
               local_268 * local_3c8 +
               fStack_4d4 * fVar23 +
               fVar32 * fStack_4d4 +
               fVar14 * local_3c8 +
               -fStack_92c * local_928 * fVar31 * local_4d8 +
               fStack_4d4 * local_228 +
               fStack_934 * fStack_2fc * fVar31 * local_4d8 +
               fStack_4cc * local_2f8 +
               local_2c8 * local_4d8 +
               local_898 * local_728 * local_928 * local_4d8 +
               fStack_4d4 * local_318 + -local_338 * local_748 * fStack_4cc;
      local_698._0_4_ = (undefined4)uVar8;
      fVar14 = fStack_300 * local_878 * local_748;
      fStack_620 = local_2b8 * local_4d8 +
                   fVar26 * fStack_4d4 +
                   fStack_4d4 * afStack_58c[5] +
                   fStack_4d4 * local_928 * fStack_874 * local_748 +
                   local_4d8 * fStack_500 +
                   fStack_940 * fStack_4d4 +
                   fStack_4d4 * local_518 * local_748 +
                   local_4d8 * local_298 +
                   fStack_4d4 * local_2a8 +
                   fStack_4cc * fStack_750 +
                   local_3c8 * -fStack_314 +
                   fStack_4d4 * local_548 +
                   local_258 * local_3c8 +
                   fStack_4d4 * fStack_570 +
                   local_2e8 * fStack_4d4 +
                   fStack_630 * local_3c8 +
                   fStack_884 * local_4d8 +
                   local_4d8 * local_888 +
                   fVar12 * local_4d8 +
                   fStack_4d4 * local_2d8 +
                   fStack_2c4 * local_4d8 +
                   local_898 * fVar24 * local_308 * local_4d8 +
                   fStack_4cc * -fStack_3e4 +
                   local_328 * fVar31 * local_4d8 +
                   fStack_374 * local_4d8 +
                   fStack_4d4 * fVar31 * fStack_2fc * fVar25 +
                   local_4d8 * local_3e8 +
                   fStack_4cc * local_388 +
                   -(fVar25 * local_308) * local_7d8 * local_4d8 +
                   ((local_3c8 * fVar31 * fVar25 * local_308 + local_3b8 * fStack_4cc) -
                   local_378 * fStack_4d4);
      fStack_61c = fStack_2b4 * fStack_4d4 +
                   fVar9 * fStack_4d4 +
                   fStack_4d0 * fStack_564 +
                   local_1f8 * fVar14 +
                   local_4d8 * fStack_504 +
                   (float)local_948 * fStack_4d4 +
                   local_4d8 * fStack_244 +
                   fStack_4d4 * local_4f8 +
                   fStack_4d4 * fStack_2a4 +
                   local_3c8 * fStack_74c +
                   fVar19 * fStack_4d0 +
                   local_1f8 * fVar29 +
                   fStack_254 * local_4d8 +
                   local_4d8 * afStack_58c[5] +
                   fStack_2e4 * fStack_4d4 +
                   local_638 * local_4d8 +
                   -local_888 * fStack_4d4 +
                   fStack_4d4 * local_218 +
                   fStack_940 * local_4d8 +
                   local_4d8 * fStack_2d4 +
                   fVar21 * fStack_4d4 +
                   local_898 * fStack_334 * local_4d8 +
                   fStack_4cc * -fStack_314 +
                   local_548 * local_4d8 +
                   -(local_898 * fVar30) * fStack_4d4 +
                   fStack_4cc * local_748 * fVar30 +
                   local_3c8 * fStack_3e4 +
                   local_4d8 * fStack_570 +
                   fVar31 * fStack_2e0 * fStack_4d4 +
                   ((local_4d8 * -(local_7d8 * fVar22) +
                    (((((-local_378 * local_4d8 + fVar27 + fVar28) - fVar13) - local_348) +
                      local_358 + local_368 + local_398) - local_3a8)) - fStack_374 * fStack_4d4);
      local_618 = (local_208 * fStack_4d4 +
                  ((local_288 * local_738 * fStack_4d4 +
                   local_238 * fStack_4d0 +
                   local_538 + ((fVar23 - fVar17 * local_1f8) - local_248 * fStack_4d0)) -
                  local_568 * local_4d8)) - local_828 * local_4d8;
      local_628._4_4_ =
           fStack_2b4 * fStack_4d4 +
           fVar9 * fStack_4d4 +
           fStack_4d0 * fStack_564 +
           local_1f8 * fVar14 +
           local_4d8 * fStack_504 +
           local_2b8 * fStack_4d4 +
           local_4d8 * fStack_244 +
           fStack_4d4 * -local_4f8 +
           fStack_4d4 * local_298 +
           -fStack_74c * local_3c8 +
           fVar19 * fStack_4d0 +
           fVar29 * local_1f8 +
           fStack_264 * local_4d8 +
           local_4d8 * fVar20 +
           fVar16 * fStack_4d4 +
           fVar18 * local_4d8 +
           local_888 * fStack_4d4 +
           fStack_4d4 * fStack_224 +
           fVar10 * local_4d8 +
           local_4d8 * fStack_2f4 +
           fStack_2c4 * fStack_4d4 +
           -(local_898 * fStack_334) * local_4d8 +
           fStack_4cc * fStack_314 +
           fVar30 * local_7d8 * local_4d8 +
           local_898 * fVar30 * fStack_4d4 +
           (((((fStack_374 * fStack_4d4 +
               local_7d8 * fVar22 * local_4d8 +
               ((((((local_378 * local_4d8 - fVar27) - fVar28) + fVar13 + local_348) - local_358) -
                local_368) - local_398) + local_3a8) - fVar31 * fStack_2e0 * fStack_4d4) -
             fStack_570 * local_4d8) - fStack_3e4 * local_3c8) - local_748 * fVar30 * fStack_4cc);
      local_628._0_4_ =
           local_828 * local_4d8 +
           (float)local_698._0_4_ * fStack_4d4 +
           local_4d8 * local_568 +
           fStack_4d4 * -(local_288 * local_738) +
           fStack_4d0 * local_508 +
           local_1f8 * -local_528 + fStack_4d0 * local_248 + local_1f8 * fVar17 + fVar23;
      _local_948 = auVar2;
      fStack_924 = local_928;
      fStack_920 = local_928;
      fStack_91c = local_928;
      fStack_894 = local_898;
      fStack_890 = local_898;
      fStack_88c = local_898;
      fStack_804 = fStack_92c;
      fStack_800 = fStack_92c;
      fStack_7fc = fStack_92c;
      fStack_7c4 = fStack_934;
      fStack_7c0 = fStack_930;
      fStack_7bc = fStack_92c;
      fStack_744 = local_748;
      fStack_740 = local_748;
      fStack_73c = local_748;
      local_718 = fStack_934;
      fStack_714 = fStack_934;
      fStack_710 = fStack_934;
      fStack_70c = fStack_934;
      local_708 = fStack_7b4;
      fStack_704 = fStack_7b4;
      fStack_700 = fStack_7b4;
      fStack_6fc = fStack_7b4;
      local_6f8 = fStack_92c;
      fStack_6f4 = fStack_92c;
      fStack_6f0 = fStack_92c;
      fStack_6ec = fStack_92c;
      local_698 = auVar1;
      fStack_62c = local_748;
      fStack_560 = afStack_58c[5];
      fStack_55c = fStack_574;
      local_558 = local_568;
      fStack_554 = fStack_92c;
      fStack_550 = fStack_930;
      fStack_54c = fStack_92c;
      fStack_534 = fStack_934;
      fStack_530 = fStack_934;
      fStack_52c = fStack_934;
      fStack_524 = fStack_934;
      fStack_520 = fStack_934;
      fStack_51c = fStack_934;
      fStack_514 = fStack_934;
      fStack_510 = fStack_934;
      fStack_50c = fStack_934;
      fStack_4f4 = local_748;
      fStack_4f0 = local_748;
      fStack_4ec = local_748;
      local_3d8 = fStack_4cc;
      fStack_3d4 = fStack_4cc;
      fStack_3d0 = fStack_4cc;
      fStack_3cc = fStack_4cc;
      fStack_3c4 = local_3c8;
      fStack_3c0 = local_3c8;
      fStack_3bc = local_3c8;
      fStack_3b4 = local_748;
      fStack_3b0 = local_748;
      fStack_3ac = local_748;
      fStack_3a4 = fStack_3e4;
      fStack_3a0 = fStack_3e0;
      fStack_39c = fStack_3dc;
      fStack_394 = local_748;
      fStack_390 = local_748;
      fStack_38c = local_748;
      fStack_384 = fStack_570;
      fStack_37c = fStack_56c;
      fStack_364 = local_748;
      fStack_35c = local_898;
      fStack_344 = local_748;
      fStack_340 = local_748;
      fStack_33c = local_748;
      fStack_304 = local_928;
      fStack_2f0 = local_748;
      fStack_2cc = fStack_2fc;
      fStack_2c0 = fStack_2fc;
      fStack_2a0 = local_898;
      fStack_294 = fStack_334;
      fStack_290 = fStack_334;
      fStack_28c = fStack_334;
      fStack_284 = fStack_92c;
      fStack_280 = fStack_930;
      fStack_27c = fStack_92c;
      local_278 = local_308;
      fStack_274 = local_928;
      fStack_270 = fStack_300;
      fStack_26c = fStack_2fc;
      fStack_260 = local_748;
      fStack_250 = fStack_934;
      fStack_24c = local_748;
      fStack_234 = fStack_934;
      fStack_230 = fStack_934;
      fStack_22c = fStack_934;
      fStack_220 = fStack_92c;
      fStack_214 = fStack_92c;
      fStack_210 = fStack_92c;
      fStack_20c = fStack_92c;
      fStack_204 = fStack_7b4;
      fStack_200 = fStack_7b4;
      fStack_1fc = fStack_7b4;
      o4_roots<float>((vector<float,_std::allocator<float>_> *)&local_6e8,
                      (Matrix<float,_5,_1,_0,_5,_1> *)&local_628);
      if (local_6e8.m_src != (SrcEvaluatorType *)local_6e8.m_dst) {
        local_7e8._0_4_ = (float)local_7e8._0_4_ * local_738;
        local_708 = local_708 * (float)local_4e8._0_4_;
        local_7b8 = local_7b8 * local_748 +
                    local_718 * local_7d8 + local_7c8 * local_898 + local_6f8 * fVar31 +
                    (float)local_7e8._0_4_ + local_708;
        local_728 = local_728 * local_898;
        local_6f8 = -(local_6f8 * fVar31);
        fStack_6f4 = -fStack_6f4;
        fStack_6f0 = -fStack_6f0;
        fStack_6ec = -fStack_6ec;
        local_888 = -local_718;
        fStack_884 = -fStack_714;
        fStack_880 = -fStack_710;
        fStack_87c = -fStack_70c;
        fVar11 = fVar11 * local_748;
        local_738 = local_938 * local_7d8;
        fStack_734 = fStack_934;
        fStack_730 = fStack_930;
        fStack_72c = fStack_92c;
        local_7d8 = local_7d8 * local_888;
        fStack_894 = -fStack_874;
        fStack_890 = -fStack_870;
        fStack_88c = -fStack_86c;
        local_898 = -local_878 * local_898;
        local_808 = local_808 * local_748;
        fStack_7f4 = -fStack_7f4;
        fStack_7f0 = -fStack_7f0;
        fStack_7ec = -fStack_7ec;
        local_7f8 = -local_7f8 * fVar31;
        local_7c8 = local_7c8 * local_748;
        local_718 = local_718 * fVar31 - local_7c8;
        local_888 = local_888 * fVar31;
        local_938 = local_938 * fVar31;
        local_878 = local_878 * local_748;
        uVar8 = 0;
        do {
          local_928 = *(float *)((long)&(local_6e8.m_dst)->
                                        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>_>
                                + uVar8 * 4);
          local_76c = -(local_7f8 * local_928 +
                       local_808 * local_928 +
                       local_898 * local_928 +
                       local_738 * local_928 +
                       local_708 * local_928 * local_928 +
                       (float)local_7e8._0_4_ * local_928 * local_928 +
                       fVar11 * local_928 * local_928 +
                       local_7d8 * local_928 * local_928 +
                       local_928 * local_6f8 * local_928 +
                       local_728 * local_928 * local_928 + local_7b8) /
                      (local_878 * local_928 +
                      local_938 * local_928 +
                      local_888 * local_928 * local_928 +
                      local_7c8 * local_928 * local_928 + local_718);
          fVar23 = local_928 * local_928;
          local_688._0_4_ = local_928 * -2.0;
          fVar9 = 1.0 - fVar23;
          local_918 = (undefined1  [8])&local_978;
          uStack_910._0_4_ = 0.0;
          uStack_910._4_4_ = 0.0;
          uStack_908._0_4_ = 1.4013e-45;
          uStack_908._4_4_ = 0.0;
          uStack_900 = (XprTypeNested)0x1;
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = fVar9;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_918,
                              (Scalar *)local_688);
          local_868 = (undefined1  [8])((ulong)local_868 & 0xffffffff00000000);
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar4,(Scalar *)local_868);
          local_798.m_xpr._0_4_ = local_928 + local_928;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar4,(Scalar *)&local_798);
          local_788._0_4_ = fVar9;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar4,(Scalar *)local_788);
          local_770 = 0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar4,(Scalar *)&local_770);
          local_774 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar4,&local_774);
          local_778 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar4,&local_778);
          fVar23 = fVar23 + 1.0;
          local_77c = fVar23;
          Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                    (pCVar4,&local_77c);
          if (((undefined1 *)
               ((long)&(((DstXprType *)uStack_900)->
                       super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                       ).
                       super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                       .m_data + CONCAT44(uStack_910._4_4_,(float)uStack_910)) != (undefined1 *)0x3)
             || (CONCAT44(uStack_908._4_4_,(float)uStack_908) != 3)) {
            __function = 
            "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
            ;
LAB_001a4891:
            __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                          ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
          }
          fVar23 = 1.0 / fVar23;
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] = local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[2] * fVar23;
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] = local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[3] * fVar23;
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[1] * fVar23;
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[0] * fVar23;
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4] = fVar23 * local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[4];
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] = fVar23 * local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[5];
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] = fVar23 * local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[6];
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[7] = fVar23 * local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[7];
          local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[8] = fVar23 * local_978.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[8];
          local_918 = (undefined1  [8])local_788;
          uStack_910._0_4_ = 0.0;
          uStack_910._4_4_ = 0.0;
          uStack_908._0_4_ = 1.4013e-45;
          uStack_908._4_4_ = 0.0;
          uStack_900 = (XprTypeNested)0x1;
          local_788._0_4_ = 0.0;
          local_688._0_4_ = 0.0;
          this = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_918,
                            (Scalar *)local_688);
          Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(this,&local_76c);
          if (((undefined1 *)
               ((long)&(((DstXprType *)uStack_900)->
                       super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                       ).
                       super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                       .m_data + CONCAT44(uStack_910._4_4_,(float)uStack_910)) != (undefined1 *)0x3)
             || (CONCAT44(uStack_908._4_4_,(float)uStack_908) != 1)) {
            __function = 
            "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
            ;
            goto LAB_001a4891;
          }
          local_688._0_4_ = 1.0;
          local_688._4_4_ = 0;
          uStack_680._0_4_ = 0;
          uStack_680._4_4_ = 0;
          uStack_678._0_4_ = 0;
          uStack_678._4_4_ = 0x3f800000;
          local_670 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                       *)0x0;
          uStack_668 = 0;
          local_660 = 0x3f800000;
          local_64c = 0x3f800000;
          lVar5 = 0;
          pfVar7 = (float *)&local_978;
          do {
            *(float *)(local_688 + lVar5 + 8) = pfVar7[2];
            *(undefined8 *)(local_688 + lVar5) = *(undefined8 *)pfVar7;
            pfVar7 = pfVar7 + 3;
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x30);
          local_650 = local_788._8_4_;
          local_658 = CONCAT44(local_788._4_4_,local_788._0_4_);
          local_798.m_xpr = &local_428;
          local_790 = (float *)local_688;
          Eigen::internal::
          Assignment<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<float,_4,_4,_0,_4,_4> *)local_918,&local_798,
                (assign_op<float,_float> *)&local_770);
          fVar9 = *local_790;
          fVar23 = local_790[1];
          fVar10 = local_790[2];
          fVar12 = local_790[3];
          fVar14 = fVar12 * (float)local_8e8 +
                   fVar10 * (float)local_8f8 +
                   fVar23 * (float)uStack_908 + fVar9 * (float)local_918._0_4_;
          fVar15 = fVar12 * local_8e8._4_4_ +
                   fVar10 * local_8f8._4_4_ +
                   fVar23 * uStack_908._4_4_ + fVar9 * (float)local_918._4_4_;
          fVar16 = fVar12 * (float)uStack_8e0 +
                   fVar10 * (float)uStack_8f0 +
                   fVar23 * (float)uStack_900 + fVar9 * (float)uStack_910;
          fVar17 = fVar12 * uStack_8e0._4_4_ +
                   fVar10 * uStack_8f0._4_4_ + fVar23 * uStack_900._4_4_ + fVar9 * uStack_910._4_4_;
          fVar9 = local_790[4];
          fVar23 = local_790[5];
          fVar10 = local_790[6];
          fVar12 = local_790[7];
          fVar18 = fVar12 * (float)local_8e8 +
                   fVar10 * (float)local_8f8 +
                   fVar23 * (float)uStack_908 + fVar9 * (float)local_918._0_4_;
          fVar19 = fVar12 * local_8e8._4_4_ +
                   fVar10 * local_8f8._4_4_ +
                   fVar23 * uStack_908._4_4_ + fVar9 * (float)local_918._4_4_;
          fVar20 = fVar12 * (float)uStack_8e0 +
                   fVar10 * (float)uStack_8f0 +
                   fVar23 * (float)uStack_900 + fVar9 * (float)uStack_910;
          fVar21 = fVar12 * uStack_8e0._4_4_ +
                   fVar10 * uStack_8f0._4_4_ + fVar23 * uStack_900._4_4_ + fVar9 * uStack_910._4_4_;
          fVar9 = local_790[8];
          fVar23 = local_790[9];
          fVar10 = local_790[10];
          fVar12 = local_790[0xb];
          fVar13 = fVar12 * (float)local_8e8 +
                   fVar10 * (float)local_8f8 +
                   fVar23 * (float)uStack_908 + fVar9 * (float)local_918._0_4_;
          fVar22 = fVar12 * local_8e8._4_4_ +
                   fVar10 * local_8f8._4_4_ +
                   fVar23 * uStack_908._4_4_ + fVar9 * (float)local_918._4_4_;
          fVar24 = fVar12 * (float)uStack_8e0 +
                   fVar10 * (float)uStack_8f0 +
                   fVar23 * (float)uStack_900 + fVar9 * (float)uStack_910;
          fVar25 = fVar12 * uStack_8e0._4_4_ +
                   fVar10 * uStack_8f0._4_4_ + fVar23 * uStack_900._4_4_ + fVar9 * uStack_910._4_4_;
          fVar9 = local_790[0xc];
          fVar23 = local_790[0xd];
          fVar10 = local_790[0xe];
          fVar12 = local_790[0xf];
          fVar26 = fVar12 * (float)local_8e8 +
                   fVar10 * (float)local_8f8 +
                   fVar23 * (float)uStack_908 + fVar9 * (float)local_918._0_4_;
          fVar27 = fVar12 * local_8e8._4_4_ +
                   fVar10 * local_8f8._4_4_ +
                   fVar23 * uStack_908._4_4_ + fVar9 * (float)local_918._4_4_;
          fVar28 = fVar12 * (float)uStack_8e0 +
                   fVar10 * (float)uStack_8f0 +
                   fVar23 * (float)uStack_900 + fVar9 * (float)uStack_910;
          fVar9 = fVar12 * uStack_8e0._4_4_ +
                  fVar10 * uStack_8f0._4_4_ + fVar23 * uStack_900._4_4_ + fVar9 * uStack_910._4_4_;
          fStack_830 = local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xf] * fVar28 +
                       local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xe] * fVar24 +
                       local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xd] * fVar20 +
                       local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xc] * fVar16;
          fStack_82c = local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xf] * fVar9 +
                       local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xe] * fVar25 +
                       local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xd] * fVar21 +
                       local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xc] * fVar17;
          local_868._4_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[3] * fVar27 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2] * fVar22 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1] * fVar19 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0] * fVar15;
          local_868._0_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[3] * fVar26 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2] * fVar13 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1] * fVar18 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0] * fVar14;
          uStack_860._4_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[3] * fVar9 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2] * fVar25 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1] * fVar21 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0] * fVar17;
          uStack_860._0_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[3] * fVar28 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2] * fVar24 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1] * fVar20 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0] * fVar16;
          local_858._4_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[7] * fVar27 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[6] * fVar22 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[5] * fVar19 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[4] * fVar15;
          local_858._0_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[7] * fVar26 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[6] * fVar13 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[5] * fVar18 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[4] * fVar14;
          uStack_850 = (XprTypeNested)
                       CONCAT44(local_4c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] * fVar9 +
                                local_4c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] * fVar25 +
                                local_4c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] * fVar21 +
                                local_4c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] * fVar17,
                                local_4c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] * fVar28 +
                                local_4c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] * fVar24 +
                                local_4c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] * fVar20 +
                                local_4c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] * fVar16);
          local_848._4_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xb] * fVar27 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[10] * fVar22 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[9] * fVar19 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[8] * fVar15;
          local_848._0_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xb] * fVar26 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[10] * fVar13 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[9] * fVar18 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[8] * fVar14;
          uStack_840._4_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xb] * fVar9 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[10] * fVar25 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[9] * fVar21 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[8] * fVar17;
          uStack_840._0_4_ =
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xb] * fVar28 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[10] * fVar24 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[9] * fVar20 +
               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[8] * fVar16;
          local_838 = CONCAT44(local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xf] * fVar27 +
                               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xe] * fVar22 +
                               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xd] * fVar19 +
                               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xc] * fVar15,
                               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xf] * fVar26 +
                               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xe] * fVar13 +
                               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xd] * fVar18 +
                               local_4c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xc] * fVar14);
          __position._M_current = *(Matrix<float,_4,_4,_0,_4,_4> **)(local_7a0 + 8);
          if (__position._M_current == *(Matrix<float,_4,_4,_0,_4,_4> **)(local_7a0 + 0x10)) {
            std::
            vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
            _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                      (local_7a0,__position,(Matrix<float,_4,_4,_0,_4,_4> *)local_868);
          }
          else {
            *(Index *)(((__position._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 0xc) = local_838;
            *(ulong *)(((__position._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 0xe) = CONCAT44(fStack_82c,fStack_830);
            *(long *)(((__position._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                      array + 8) = local_848;
            *(long *)(((__position._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                      array + 10) = uStack_840;
            *(long *)(((__position._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                      array + 4) = local_858;
            *(XprTypeNested *)
             (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
              .m_storage.m_data.array + 6) = uStack_850;
            *(undefined1 (*) [8])
             ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
             m_storage.m_data.array = local_868;
            *(long *)(((__position._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                      array + 2) = uStack_860;
            *(Matrix<float,_4,_4,_0,_4,_4> **)(local_7a0 + 8) = __position._M_current + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)((long)local_6e8.m_src - (long)local_6e8.m_dst >> 2));
      }
      if ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_6e8.m_dst !=
          (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)0x0) {
        operator_delete(local_6e8.m_dst,(long)local_6e8.m_functor - (long)local_6e8.m_dst);
      }
      if (local_488.
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_488.
                        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_488.
                              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_488.
                              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_470.
          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_470.
                        super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_470.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_470.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_458.
          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_458.
                        super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_458.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_458.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_440.
          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_440.
                        super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_440.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_440.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)local_7a0;
    }
  }
  local_628 = (float *)local_688;
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, 6, 6>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 6, 6>>]"
               );
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M2L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){
	
	// check input vectors size
	if(lCPair.size() < 1 && lPair.size() < 2){
		std::cerr << "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;

	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines2 = getPluckerCoord(lPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines3 = getPluckerCoord(lPair[1]);
	

	// move frames to first line and z axis with its direction
	std::vector<Eigen::Matrix<floatPrec,4,4>> trans = getPredefinedTransformations1M1Q(lines1[0],lines1[1]);
	Eigen::Matrix<floatPrec,4,4> TU1 = trans[0], TU2 = trans[1];
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform lines to new frame
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,6,1> lU3 = TUL1*lines2[0];
	Eigen::Matrix<floatPrec,6,1> lU4 = TUL2*lines2[1];
	Eigen::Matrix<floatPrec,6,1> lU5 = TUL1*lines3[0];
	Eigen::Matrix<floatPrec,6,1> lU6 = TUL2*lines3[1];

	// define coeffs
	floatPrec l11 = lU3(0),l12 = lU3(1),l13 = lU3(2),l14 = lU3(3),l15 = lU3(4),l16 = lU3(5);
	floatPrec l21 = lU5(0),l22 = lU5(1),l23 = lU5(2),l24 = lU5(3),l25 = lU5(4),l26 = lU5(5);
	floatPrec m11 = lU4(0),m12 = lU4(1),m13 = lU4(2),m14 = lU4(3),m15 = lU4(4),m16 = lU4(5);
	floatPrec m21 = lU6(0),m22 = lU6(1),m23 = lU6(2),m24 = lU6(3),m25 = lU6(4),m26 = lU6(5);

	floatPrec a = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22     + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 + l11*l23*m12*m26 + l11*l26*m12*m23 - l12*l23*m11*m26 - l12*l26*m11*m23 - l13*l21*m16*m22 + l13*l22*m16*m21 - l16*l21*m13*m22 + l16*l22*m13*m21;
	floatPrec b = 2*l11*l21*m14*m21 - 2*l11*l21*m11*m24 - 2*l11*l24*m11*m21 + 2*l14*l21*m11*m21 + 2*l11*l21*m12*m25 - 2*l11*l21*m15*m22 - 2*l11*l22*m11*m25 - 2*l11*l22*m12*m24 + 2*l11*l22*m14*m22 + 2*l11*l22*m15*m21 + 2*l11*l24*m12*m22 - 2*l11*l25*m11*m22 - 2*l11*l25*m12*m21 - 2*l12*l21*m11*m25 - 2*l12*l21*m12*m24 + 2*l12*l21*m14*m22 + 2*l12*l21*m15*m21 + 2*l12*l22*m11*m24 - 2*l12*l22*m14*m21 - 2*l12*l24*m11*m22 - 2*l12*l24*m12*m21 + 2*l12*l25*m11*m21 - 2*l14*l21*m12*m22 + 2*l14*l22*m11*m22 + 2*l14*l22*m12*m21 + 2*l15*l21*m11*m22 + 2*l15*l21*m12*m21 - 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 - 2*l12*l22*m12*m25 + 2*l12*l22*m15*m22 - 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 + 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec c = 4*l11*l21*m11*m25 + 2*l11*l21*m12*m24 - 2*l11*l21*m14*m22 - 4*l11*l21*m15*m21 - 4*l11*l22*m11*m24 + 2*l11*l22*m14*m21 + 4*l11*l24*m11*m22 + 2*l11*l24*m12*m21 - 4*l11*l25*m11*m21 - 2*l12*l21*m11*m24 + 4*l12*l21*m14*m21 - 2*l12*l24*m11*m21 - 2*l14*l21*m11*m22 - 4*l14*l21*m12*m21 + 2*l14*l22*m11*m21 + 4*l15*l21*m11*m21 + 2*l11*l22*m12*m25 - 4*l11*l22*m15*m22 + 2*l11*l25*m12*m22 + 4*l12*l21*m12*m25 - 2*l12*l21*m15*m22 - 2*l12*l22*m11*m25 - 4*l12*l22*m12*m24 + 4*l12*l22*m14*m22 + 2*l12*l22*m15*m21 + 4*l12*l24*m12*m22 - 2*l12*l25*m11*m22 - 4*l12*l25*m12*m21 - 4*l14*l22*m12*m22 - 2*l15*l21*m12*m22 + 4*l15*l22*m11*m22 + 2*l15*l22*m12*m21; 
	floatPrec d = 2*l11*l21*m11*m24 - 2*l11*l21*m14*m21 + 2*l11*l24*m11*m21 - 2*l14*l21*m11*m21 - 2*l11*l21*m12*m25 + 2*l11*l21*m15*m22 + 2*l11*l22*m11*m25 + 2*l11*l22*m12*m24 - 2*l11*l22*m14*m22 - 2*l11*l22*m15*m21 - 2*l11*l24*m12*m22 + 2*l11*l25*m11*m22 + 2*l11*l25*m12*m21 + 2*l12*l21*m11*m25 + 2*l12*l21*m12*m24 - 2*l12*l21*m14*m22 - 2*l12*l21*m15*m21 - 2*l12*l22*m11*m24 + 2*l12*l22*m14*m21 + 2*l12*l24*m11*m22 + 2*l12*l24*m12*m21 - 2*l12*l25*m11*m21 + 2*l14*l21*m12*m22 - 2*l14*l22*m11*m22 - 2*l14*l22*m12*m21 - 2*l15*l21*m11*m22 - 2*l15*l21*m12*m21 + 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 + 2*l12*l22*m12*m25 - 2*l12*l22*m15*m22 + 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 - 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec e = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22 + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 - l11*l23*m12*m26 - l11*l26*m12*m23 + l12*l23*m11*m26 + l12*l26*m11*m23 + l13*l21*m16*m22 - l13*l22*m16*m21 + l16*l21*m13*m22 - l16*l22*m13*m21;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = a;
	factors(1, 0) = b;
	factors(2, 0) = c;
	factors(3, 0) = d;
	factors(4, 0) = e;
	vector<floatPrec> realRoots = o4_roots(factors);
	for(size_t iter = 0; iter < realRoots.size(); iter++){
		floatPrec s = realRoots[iter];
		
		floatPrec tz = -(l11*m14 + l14*m11 + l12*m15 + l15*m12 + l13*m16 + l16*m13 - l11*m14*s*s - l14*m11*s*s - l12*m15*s*s - l15*m12*s*s + l13*m16*s*s + l16*m13*s*s + 2*l11*m15*s - 2*l12*m14*s + 2*l14*m12*s - 2*l15*m11*s)/(l12*m11 - l11*m12 + l11*m12*s*s - l12*m11*s*s + 2*l11*m11*s + 2*l12*m12*s);

		Eigen::Matrix<floatPrec,3,3> R;
		R << 1-s*s, -2*s, 0, 2*s, 1-s*s, 0, 0, 0, 1+s*s;
		R = 1/(1+s*s)*R;
		Eigen::Matrix<floatPrec,3,1> t;
		t << 0,0,tz;
		Eigen::Matrix<floatPrec,4,4> Tw = Eigen::Matrix<floatPrec,4,4>::Identity(), sol;
		Tw.topLeftCorner(3,3) = R;
		Tw.topRightCorner(3,1) = t;
		sol = TU2.inverse()*Tw*TU1;
		out.push_back(sol);
	}

	return out;
}